

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

int main(int argc,char **argv)

{
  socketinfo *psVar1;
  __pid_t _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_EAX;
  time_t tVar6;
  int *piVar7;
  service *psVar8;
  time_t tVar9;
  int iVar10;
  char *fmt;
  listnode *plVar11;
  uint uVar12;
  int status;
  int s [2];
  pollfd ufds [4];
  char tmp [92];
  sigaction act;
  undefined8 uStack_2f0;
  uint local_2e0;
  int local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  pollfd local_2c8;
  uint local_2c0;
  undefined2 local_2bc;
  short local_2ba;
  uint local_2b8;
  undefined2 local_2b4;
  short local_2b2;
  undefined4 local_2ac;
  char local_2a8 [96];
  int local_248;
  uint local_244;
  uint local_240;
  _union_1457 local_c8;
  sigset_t local_c0;
  undefined4 local_40;
  undefined8 local_38;
  
  uStack_2f0 = (code *)0x1059c9;
  _Var2 = fork();
  if (_Var2 == 0) {
    uStack_2f0 = (code *)0x105bd4;
    bootchart_count = bootchart_init();
    if (bootchart_count < 1) {
      if (bootchart_count < 0) {
        fmt = "<3>init: bootcharting init failure\n";
        iVar3 = 3;
      }
      else {
        fmt = "<5>init: bootcharting ignored\n";
        iVar3 = 5;
      }
      iVar10 = 0;
      uStack_2f0 = (code *)0x105c4b;
      log_write(iVar3,fmt);
    }
    else {
      iVar10 = 0;
      uStack_2f0 = (code *)0x105bf9;
      log_write(5,"<5>init: bootcharting started (period=%d ms)\n",
                (ulong)(uint)(bootchart_count * 200));
      while (0 < bootchart_count) {
        uStack_2f0 = (code *)0x105c07;
        iVar3 = bootchart_step();
        if (iVar3 < 0) break;
        bootchart_count = bootchart_count + -1;
        uStack_2f0 = (code *)0x105c1b;
        usleep(200000);
      }
      uStack_2f0 = (code *)0x105c22;
      bootchart_finish();
    }
  }
  else {
    local_c8.sa_handler = sigchld_handler;
    local_40 = 1;
    local_38 = 0;
    uStack_2f0 = (code *)0x1059fe;
    sigemptyset(&local_c0);
    uStack_2f0 = (code *)0x105a12;
    sigaction(0x11,(sigaction *)&local_c8,(sigaction *)0x0);
    uStack_2f0 = (code *)0x105a19;
    umask(0);
    uStack_2f0 = (code *)0x105a1e;
    log_init();
    uStack_2f0 = (code *)0x105a31;
    log_write(6,"<6>init: reading config file\n");
    uStack_2f0 = (code *)0x105a3d;
    parse_config_file("/platform//init.rc");
    uStack_2f0 = (code *)0x105a44;
    import_kernel_cmdline(0);
    uStack_2f0 = (code *)0x105a57;
    action_for_each_trigger("early-init",action_add_queue_tail);
    uStack_2f0 = (code *)0x105a5c;
    drain_action_queue();
    uStack_2f0 = (code *)0x105a6f;
    log_write(6,"<6>init: device init\n");
    uStack_2f0 = (code *)0x105a74;
    property_init();
    if (console[0] != '\0') {
      uStack_2f0 = (code *)0x105a9f;
      snprintf(local_2a8,0x5c,"/dev/%s",console);
      uStack_2f0 = (code *)0x105aa7;
      console_name = strdup(local_2a8);
    }
    uStack_2f0 = (code *)0x105ac1;
    iVar3 = open(console_name,2);
    if (-1 < iVar3) {
      have_console = 1;
    }
    uStack_2f0 = (code *)0x105ad3;
    close(iVar3);
    if (qemu[0] != '\0') {
      uStack_2f0 = (code *)0x105ae6;
      import_kernel_cmdline(1);
    }
    uStack_2f0 = (code *)0x105af9;
    action_for_each_trigger("init",action_add_queue_tail);
    uStack_2f0 = (code *)0x105afe;
    drain_action_queue();
    uStack_2f0 = (code *)0x105b03;
    uVar4 = start_property_service();
    uStack_2f0 = (code *)0x105b1b;
    iVar3 = socketpair(1,1,0,&local_2dc);
    uVar5 = local_2d8;
    uVar12 = 0xffffffff;
    if (iVar3 == 0) {
      signal_fd = local_2dc;
      uStack_2f0 = (code *)0x105b45;
      fcntl(local_2dc,2,1);
      uStack_2f0 = (code *)0x105b5a;
      fcntl(local_2dc,4,0x800);
      uStack_2f0 = (code *)0x105b6f;
      fcntl(local_2d8,2,1);
      uStack_2f0 = (code *)0x105b84;
      fcntl(local_2d8,4,0x800);
      uVar12 = uVar5;
    }
    uStack_2f0 = (code *)0x105b98;
    mkfifo("/dev/initctl",0x180);
    uStack_2f0 = (code *)0x105ba7;
    local_2d0 = open("/dev/initctl",0x800);
    if (-1 < (int)(local_2d0 | uVar4 | uVar12)) {
      uStack_2f0 = (code *)0x105c69;
      umask(0x12);
      uStack_2f0 = (code *)0x105c7f;
      action_for_each_trigger("early-boot",action_add_queue_tail);
      uStack_2f0 = (code *)0x105c8e;
      action_for_each_trigger("boot",action_add_queue_tail);
      uStack_2f0 = (code *)0x105c93;
      drain_action_queue();
      uStack_2f0 = (code *)0x105ca6;
      log_write(3,"<3>init: DONE\n");
      local_2c8.events = 1;
      local_2bc = 1;
      local_2b4 = 1;
      local_2ac = 0;
      local_2d4 = uVar4;
      local_2cc = uVar12;
      local_2c8.fd = local_2d0;
      local_2c0 = uVar4;
      local_2b8 = uVar12;
      do {
        while( true ) {
          do {
            local_2c8.revents = 0;
            local_2ba = 0;
            local_2b2 = 0;
            uStack_2f0 = (code *)0x105d01;
            drain_action_queue();
            process_needs_restart = 0;
            uStack_2f0 = (code *)0x105d1d;
            service_for_each_flags(8,restart_service_if_needed);
            tVar9 = process_needs_restart;
            iVar3 = -1;
            if (process_needs_restart != 0) {
              uStack_2f0 = (code *)0x105d33;
              tVar6 = gettime();
              iVar3 = ((int)tVar9 - (int)tVar6) * 1000;
              if (iVar3 < 1) {
                iVar3 = 0;
              }
            }
            uStack_2f0 = (code *)0x105d50;
            iVar3 = poll(&local_2c8,3,iVar3);
          } while (iVar3 < 1);
          if (local_2b2 == 1) break;
          if (local_2c8.revents == 1) {
            uStack_2f0 = (code *)0x105f85;
            log_write(6,"<6>init: %d %c",(ulong)local_244,(ulong)local_240);
            uStack_2f0 = (code *)0x105f96;
            read(local_2d0,&local_248,0x180);
            if ((local_248 == 0x3091969) && (local_244 == 1)) {
              iVar3 = (uint)(local_240 != 0x30) * 3 + 0xc;
              uStack_2f0 = sigchld_handler;
              init_reboot(iVar3);
              uStack_2f0 = (code *)CONCAT44(iVar3,extraout_EAX);
              write(signal_fd,(void *)((long)&uStack_2f0 + 4),1);
              return (int)uStack_2f0;
            }
          }
          if (local_2ba == 1) {
            uStack_2f0 = (code *)0x105fc2;
            handle_property_set_fd(local_2d4);
          }
        }
        uStack_2f0 = (code *)0x105d73;
        read(local_2cc,local_2a8,0x5c);
LAB_00105d73:
        do {
          uStack_2f0 = (code *)0x105d85;
          uVar5 = waitpid(-1,(int *)&local_2e0,1);
          if (uVar5 == 0xffffffff) {
            uStack_2f0 = (code *)0x105d92;
            piVar7 = __errno_location();
            if (*piVar7 == 4) goto LAB_00105d73;
          }
          if ((int)uVar5 < 1) break;
          uStack_2f0 = (code *)0x105dba;
          log_write(6,"<6>init: waitpid returned pid %d, status = %08x\n",(ulong)uVar5,
                    (ulong)local_2e0);
          uStack_2f0 = (code *)0x105dc2;
          psVar8 = service_find_by_pid(uVar5);
          if (psVar8 == (service *)0x0) {
            uStack_2f0 = (code *)0x105eb5;
            log_write(3,"<3>init: untracked pid %d exited\n",(ulong)uVar5);
          }
          else {
            uStack_2f0 = (code *)0x105deb;
            log_write(5,"<5>init: process \'%s\', pid %d exited\n",psVar8->name,(ulong)uVar5);
            if ((psVar8->flags & 2) == 0) {
              uStack_2f0 = (code *)0x105e01;
              kill(-uVar5,9);
              uStack_2f0 = (code *)0x105e18;
              log_write(5,"<5>init: process \'%s\' killing any children in process group\n",
                        psVar8->name);
            }
            for (psVar1 = psVar8->sockets; psVar1 != (socketinfo *)0x0; psVar1 = psVar1->next) {
              uStack_2f0 = (code *)0x105e3f;
              snprintf((char *)&local_248,0x80,"/dev/socket/%s",psVar1->name);
              uStack_2f0 = (code *)0x105e47;
              unlink((char *)&local_248);
            }
            psVar8->pid = 0;
            uVar12 = psVar8->flags;
            uVar4 = uVar12 >> 1 & 1;
            psVar8->flags = uVar4 | uVar12 & 0xfffffffb;
            if (uVar4 == 0 && (uVar12 & 1) == 0) {
              uStack_2f0 = (code *)0x105e72;
              tVar9 = gettime();
              if ((psVar8->flags & 0x20) != 0) {
                if (psVar8->time_crashed + 0xf0 < tVar9) {
                  psVar8->time_crashed = tVar9;
                  psVar8->nr_crashed = 1;
                }
                else {
                  iVar3 = psVar8->nr_crashed;
                  psVar8->nr_crashed = iVar3 + 1;
                  if (3 < iVar3) {
                    uStack_2f0 = (code *)0x105f01;
                    log_write(3,
                              "<3>init: critical process \'%s\' exited %d times in %d minutes; rebooting into recovery mode\n"
                              ,psVar8->name,4,4);
                    uStack_2f0 = (code *)0x105f06;
                    sync();
                    uStack_2f0 = (code *)&UNK_00105f10;
                    reboot(0x1234567);
                  }
                }
              }
              for (plVar11 = (psVar8->onrestart).commands.next;
                  plVar11 != &(psVar8->onrestart).commands; plVar11 = plVar11->next) {
                uStack_2f0 = (code *)0x105f34;
                (*(code *)plVar11[1].next)(*(undefined4 *)&plVar11[1].prev,plVar11 + 2);
              }
              *(byte *)&psVar8->flags = (byte)psVar8->flags | 8;
              uStack_2f0 = (code *)0x105f4e;
              notify_service_state(psVar8->name,"restarting");
            }
            else {
              uStack_2f0 = (code *)0x105eca;
              notify_service_state(psVar8->name,"stopped");
            }
          }
        } while (0 < (int)uVar5);
      } while( true );
    }
    uStack_2f0 = (code *)0x105bc8;
    log_write(3,"<3>init: init startup failure\n");
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
    int init_fd = -1;
    int property_set_fd = -1;
    int signal_recv_fd = -1;
    int fd, fd_count, s[2];
    struct sigaction act;
    char tmp[PROP_NAME_MAX];
    struct pollfd ufds[4];
    pid_t pid;

    //mount("tmpfs", "/tmp", "tmpfs", MS_NODEV|MS_NOSUID, "mode=1777");
    //mount("proc", "/proc", "proc", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);
    //mount("sysfs", "/sys", "sysfs", MS_NOEXEC|MS_NODEV|MS_NOSUID, NULL);

#if BOOTCHART
    pid = fork();
    if (!pid) { /* child process */
        bootchart_count = bootchart_init();
        if (bootchart_count > 0) {
            NOTICE("bootcharting started (period=%d ms)\n", bootchart_count*BOOTCHART_POLLING_MS);
        } else if (bootchart_count < 0) {
            ERROR("bootcharting init failure\n");
            return 0;
        } else {
            NOTICE("bootcharting ignored\n");
            return 0;
        }

        while (bootchart_count > 0) {
            if (bootchart_step() < 0)
                break;
            --bootchart_count;
            usleep(BOOTCHART_POLLING_MS*1000);
        }
        bootchart_finish();
        return 0;
    }
#endif

    act.sa_handler = sigchld_handler;
    act.sa_flags = SA_NOCLDSTOP;
    act.sa_restorer = NULL;
    sigemptyset(&act.sa_mask);
    sigaction(SIGCHLD, &act, 0);

    /* clear the umask */
    umask(0);

        /* We must have some place other than / to create the
         * device nodes for kmsg and null, otherwise we won't
         * be able to remount / read-only later on.
         * Now that tmpfs is mounted on /dev, we can actually
         * talk to the outside world.
         */
//    open_devnull_stdio();
    log_init();
    
    INFO("reading config file\n");
    parse_config_file(INITRC_FILE_PATH);

    /* pull the kernel commandline and ramdisk properties file in */
    import_kernel_cmdline(0);

    action_for_each_trigger("early-init", action_add_queue_tail);
    drain_action_queue();

    INFO("device init\n");

    property_init();

    if (console[0]) {
        snprintf(tmp, sizeof(tmp), "/dev/%s", console);
        console_name = strdup(tmp);
    }

    fd = open(console_name, O_RDWR);
    if (fd >= 0)
        have_console = 1;
    close(fd);

    if (qemu[0])
        import_kernel_cmdline(1); 
   
        /* execute all the boot actions to get us started */
    action_for_each_trigger("init", action_add_queue_tail);
    drain_action_queue();

        /* read any property files on system or data and
         * fire up the property service.  This must happen
         * after the ro.foo properties are set above so
         * that /data/local.prop cannot interfere with them.
         */
    property_set_fd = start_property_service();

    /* create a signalling mechanism for the sigchld handler */
    if (socketpair(AF_UNIX, SOCK_STREAM, 0, s) == 0) {
        signal_fd = s[0];
        signal_recv_fd = s[1];
        fcntl(s[0], F_SETFD, FD_CLOEXEC);
        fcntl(s[0], F_SETFL, O_NONBLOCK);
        fcntl(s[1], F_SETFD, FD_CLOEXEC);
        fcntl(s[1], F_SETFL, O_NONBLOCK);
    }

    mkfifo("/dev/initctl", 0600);
    init_fd = open("/dev/initctl", O_RDONLY|O_NONBLOCK);
    /* make sure we actually have all the pieces we need */
    if((init_fd < 0) ||
        (property_set_fd < 0) ||
        (signal_recv_fd < 0)) {
        ERROR("init startup failure\n");
        return 1;
    }
    umask(0022);

    /* execute all the boot actions to get us started */
    action_for_each_trigger("early-boot", action_add_queue_tail);
    action_for_each_trigger("boot", action_add_queue_tail);
    drain_action_queue();
    ERROR("DONE\n");

    ufds[0].fd = init_fd;
    ufds[0].events = POLLIN;
    ufds[1].fd = property_set_fd;
    ufds[1].events = POLLIN;
    ufds[2].fd = signal_recv_fd;
    ufds[2].events = POLLIN;
    fd_count = 3;

    ufds[3].events = 0;
    ufds[3].revents = 0;

    for(;;) {
        int nr, i, timeout = -1;

        for (i = 0; i < fd_count; i++)
            ufds[i].revents = 0;

        drain_action_queue();
        restart_processes();

        if (process_needs_restart) {
            timeout = (process_needs_restart - gettime()) * 1000;
            if (timeout < 0)
                timeout = 0;
        }

        nr = poll(ufds, fd_count, timeout);
        if (nr <= 0)
            continue;

        if (ufds[2].revents == POLLIN) {
            /* we got a SIGCHLD - reap and restart as needed */
            read(signal_recv_fd, tmp, sizeof(tmp));
            while (!wait_for_one_process(0))
                ;
            continue;
        }

        if (ufds[0].revents == POLLIN)
            handle_init_fd(init_fd);
        if (ufds[1].revents == POLLIN)
            handle_property_set_fd(property_set_fd);
    }

    return 0;
}